

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O0

SequenceParser * __thiscall
ASDCP::DCData::SequenceParser::OpenRead(SequenceParser *this,string *filename)

{
  int iVar1;
  h__SequenceParser *phVar2;
  string *filename_local;
  SequenceParser *this_local;
  Result_t *result;
  
  phVar2 = (h__SequenceParser *)operator_new(0x90);
  h__SequenceParser::h__SequenceParser(phVar2);
  mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser>::operator=
            ((mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser> *)
             &filename->_M_string_length,phVar2);
  phVar2 = mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser>::operator->
                     ((mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser> *)
                      &filename->_M_string_length);
  h__SequenceParser::OpenRead((h__SequenceParser *)this,(string *)phVar2);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar1 < 0) {
    mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser>::release
              ((mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser> *)
               &filename->_M_string_length);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::SequenceParser::OpenRead(const std::string& filename) const
{
  const_cast<ASDCP::DCData::SequenceParser*>(this)->m_Parser = new h__SequenceParser;

  Result_t result = m_Parser->OpenRead(filename);

  if ( ASDCP_FAILURE(result) )
    const_cast<ASDCP::DCData::SequenceParser*>(this)->m_Parser.release();

  return result;
}